

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

bool Assimp::Ogre::OgreXmlSerializer::ImportSkeleton(IOSystem *pIOHandler,Mesh *mesh)

{
  Skeleton *this;
  bool bVar1;
  XmlReaderPtr reader;
  OgreXmlSerializer serializer;
  
  if ((mesh == (Mesh *)0x0) || ((mesh->skeletonRef)._M_string_length == 0)) {
    bVar1 = false;
  }
  else {
    OpenReader((OgreXmlSerializer *)&reader,pIOHandler,&mesh->skeletonRef);
    bVar1 = reader.
            super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)0x0;
    if (bVar1) {
      this = (Skeleton *)operator_new(0x38);
      Skeleton::Skeleton(this);
      serializer.m_reader =
           reader.
           super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      serializer.m_currentNodeName._M_dataplus._M_p = (pointer)&serializer.m_currentNodeName.field_2
      ;
      serializer.m_currentNodeName._M_string_length = 0;
      serializer.m_currentNodeName.field_2._M_local_buf[0] = '\0';
      ReadSkeleton(&serializer,this);
      mesh->skeleton = this;
      std::__cxx11::string::~string((string *)&serializer.m_currentNodeName);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&reader.
                super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return bVar1;
}

Assistant:

bool OgreXmlSerializer::ImportSkeleton(Assimp::IOSystem *pIOHandler, Mesh *mesh)
{
    if (!mesh || mesh->skeletonRef.empty())
        return false;

    XmlReaderPtr reader = OpenReader(pIOHandler, mesh->skeletonRef);
    if (!reader.get())
        return false;

    Skeleton *skeleton = new Skeleton();
    OgreXmlSerializer serializer(reader.get());
    serializer.ReadSkeleton(skeleton);
    mesh->skeleton = skeleton;
    return true;
}